

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O0

int Mf_SetCutIsContainedOrder(Mf_Cut_t *pBase,Mf_Cut_t *pCut)

{
  uint uVar1;
  uint uVar2;
  uint local_2c;
  int nSizeC;
  int k;
  int nSizeB;
  int i;
  Mf_Cut_t *pCut_local;
  Mf_Cut_t *pBase_local;
  
  uVar1 = *(uint *)&pBase->field_0x10 >> 0x1b;
  uVar2 = *(uint *)&pCut->field_0x10 >> 0x1b;
  if (uVar1 == uVar2) {
    for (k = 0; k < (int)uVar1; k = k + 1) {
      if (pBase->pLeaves[k] != pCut->pLeaves[k]) {
        return 0;
      }
    }
    pBase_local._4_4_ = 1;
  }
  else {
    if (uVar1 <= uVar2) {
      __assert_fail("nSizeB > nSizeC",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                    ,0x3a0,"int Mf_SetCutIsContainedOrder(Mf_Cut_t *, Mf_Cut_t *)");
    }
    if (uVar2 == 0) {
      pBase_local._4_4_ = 1;
    }
    else {
      local_2c = 0;
      for (k = 0; k < (int)uVar1; k = k + 1) {
        if (pCut->pLeaves[(int)local_2c] < pBase->pLeaves[k]) {
          return 0;
        }
        if ((pBase->pLeaves[k] == pCut->pLeaves[(int)local_2c]) &&
           (local_2c = local_2c + 1, local_2c == uVar2)) {
          return 1;
        }
      }
      pBase_local._4_4_ = 0;
    }
  }
  return pBase_local._4_4_;
}

Assistant:

static inline int Mf_SetCutIsContainedOrder( Mf_Cut_t * pBase, Mf_Cut_t * pCut ) // check if pCut is contained in pBase
{
    int i, nSizeB = pBase->nLeaves;
    int k, nSizeC = pCut->nLeaves;
    if ( nSizeB == nSizeC )
    {
        for ( i = 0; i < nSizeB; i++ )
            if ( pBase->pLeaves[i] != pCut->pLeaves[i] )
                return 0;
        return 1;
    }
    assert( nSizeB > nSizeC ); 
    if ( nSizeC == 0 )
        return 1;
    for ( i = k = 0; i < nSizeB; i++ )
    {
        if ( pBase->pLeaves[i] > pCut->pLeaves[k] )
            return 0;
        if ( pBase->pLeaves[i] == pCut->pLeaves[k] )
        {
            if ( ++k == nSizeC )
                return 1;
        }
    }
    return 0;
}